

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msatVec.c
# Opt level: O2

void Msat_IntVecPushUniqueOrder(Msat_IntVec_t *p,int Entry,int fIncrease)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  bool bVar4;
  ulong uVar5;
  
  Msat_IntVecPushUnique(p,Entry);
  uVar5 = (ulong)(uint)p->nSize;
  while( true ) {
    if ((int)uVar5 < 2) {
      return;
    }
    piVar3 = p->pArray;
    iVar1 = piVar3[uVar5 - 2];
    iVar2 = piVar3[uVar5 - 1];
    bVar4 = iVar1 <= iVar2;
    if (fIncrease == 0) {
      bVar4 = iVar2 <= iVar1;
    }
    if (bVar4) break;
    piVar3[uVar5 - 1] = iVar1;
    piVar3[uVar5 - 2] = iVar2;
    uVar5 = uVar5 - 1;
  }
  return;
}

Assistant:

void Msat_IntVecPushUniqueOrder( Msat_IntVec_t * p, int Entry, int fIncrease )
{
    int Entry1, Entry2;
    int i;
    Msat_IntVecPushUnique( p, Entry );
    // find the p of the node
    for ( i = p->nSize-1; i > 0; i-- )
    {
        Entry1 = p->pArray[i  ];
        Entry2 = p->pArray[i-1];
        if (( fIncrease && Entry1 >= Entry2) ||
            (!fIncrease && Entry1 <= Entry2) )
            break;
        p->pArray[i  ] = Entry2;
        p->pArray[i-1] = Entry1;
    }
}